

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testDeleteBound(LifeTest *this)

{
  uint uVar1;
  GLenum GVar2;
  int iVar3;
  TestContext *testCtx;
  Binder *pBVar4;
  Functions *pFVar5;
  undefined1 local_38 [8];
  ResultCollector errors;
  GLuint id;
  LifeTest *this_local;
  
  errors.m_message._4_4_ = (*this->m_type->_vptr_Type[2])();
  testCtx = tcu::TestNode::getTestContext((TestNode *)this);
  ResultCollector::ResultCollector((ResultCollector *)local_38,testCtx);
  pBVar4 = binder(this);
  (*pBVar4->_vptr_Binder[2])(pBVar4,(ulong)errors.m_message._4_4_);
  (*this->m_type->_vptr_Type[3])(this->m_type,(ulong)errors.m_message._4_4_);
  uVar1 = (*this->m_type->_vptr_Type[8])();
  if ((uVar1 & 1) == 0) {
    pFVar5 = TestBase::gl(&this->super_TestBase);
    GVar2 = (*pFVar5->getError)();
    ResultCollector::check((ResultCollector *)local_38,GVar2 == 0,"Deleting bound object failed");
    pBVar4 = binder(this);
    iVar3 = (*pBVar4->_vptr_Binder[3])();
    ResultCollector::check
              ((ResultCollector *)local_38,iVar3 == 0,"Deleting bound object did not remove binding"
              );
    iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)errors.m_message._4_4_);
    ResultCollector::check
              ((ResultCollector *)local_38,(bool)(~(byte)iVar3 & 1),
               "Deleting bound object did not make its name invalid");
    pBVar4 = binder(this);
    (*pBVar4->_vptr_Binder[2])(pBVar4,0);
  }
  else {
    pFVar5 = TestBase::gl(&this->super_TestBase);
    GVar2 = (*pFVar5->getError)();
    ResultCollector::check((ResultCollector *)local_38,GVar2 == 0,"Deleting bound object failed");
    pBVar4 = binder(this);
    uVar1 = (*pBVar4->_vptr_Binder[3])();
    ResultCollector::check
              ((ResultCollector *)local_38,uVar1 == errors.m_message._4_4_,
               "Deleting bound object did not retain binding");
    iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)errors.m_message._4_4_);
    ResultCollector::check
              ((ResultCollector *)local_38,(bool)((byte)iVar3 & 1),
               "Deleting bound object made its name invalid");
    iVar3 = (*this->m_type->_vptr_Type[5])(this->m_type,(ulong)errors.m_message._4_4_);
    ResultCollector::check
              ((ResultCollector *)local_38,(bool)((byte)iVar3 & 1),
               "Deleting bound object did not flag the object for deletion");
    pBVar4 = binder(this);
    (*pBVar4->_vptr_Binder[2])(pBVar4,0);
  }
  pBVar4 = binder(this);
  iVar3 = (*pBVar4->_vptr_Binder[3])();
  ResultCollector::check((ResultCollector *)local_38,iVar3 == 0,"Unbinding didn\'t remove binding");
  iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)errors.m_message._4_4_);
  ResultCollector::check
            ((ResultCollector *)local_38,(bool)(~(byte)iVar3 & 1),
             "Name is still valid after deleting and unbinding");
  ResultCollector::~ResultCollector((ResultCollector *)local_38);
  return;
}

Assistant:

void LifeTest::testDeleteBound (void)
{
	const GLuint	id		= m_type.gen();
	ResultCollector	errors	(getTestContext());

	binder().bind(id);
	m_type.release(id);

	if (m_type.nameLingers())
	{
		errors.check(gl().getError() == GL_NO_ERROR, "Deleting bound object failed");
		errors.check(binder().getBinding() == id,
					 "Deleting bound object did not retain binding");
		errors.check(m_type.exists(id),
					 "Deleting bound object made its name invalid");
		errors.check(m_type.isDeleteFlagged(id),
					 "Deleting bound object did not flag the object for deletion");
		binder().bind(0);
	}
	else
	{
		errors.check(gl().getError() == GL_NO_ERROR, "Deleting bound object failed");
		errors.check(binder().getBinding() == 0,
					 "Deleting bound object did not remove binding");
		errors.check(!m_type.exists(id),
					 "Deleting bound object did not make its name invalid");
		binder().bind(0);
	}

	errors.check(binder().getBinding() == 0, "Unbinding didn't remove binding");
	errors.check(!m_type.exists(id), "Name is still valid after deleting and unbinding");
}